

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::node::put_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_int)> *f,
          function<void_(libtorrent::dht::item_&)> *data_cb)

{
  dht_observer *pdVar1;
  int iVar2;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  shared_ptr<libtorrent::dht::put_data> put_ta;
  __shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2> local_88;
  char hex_key [65];
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      in.m_len = (difference_type)hex_key;
      in.m_ptr = (char *)0x20;
      aux::to_hex((aux *)pk,in,(char *)f);
      (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
                (this->m_observer,1,"starting put for [ key: %s ]",hex_key);
    }
  }
  ::std::
  make_shared<libtorrent::dht::put_data,libtorrent::dht::node&,std::function<void(libtorrent::dht::item_const&,int)>&>
            ((node *)&put_ta,(function<void_(const_libtorrent::dht::item_&,_int)> *)this);
  hex_key._0_8_ = anon_unknown_0::put_data_cb;
  ::std::
  _Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
  ::
  _Tuple_impl<std::shared_ptr<libtorrent::dht::put_data>&,std::function<void(libtorrent::dht::item&)>&,void>
            ((_Tuple_impl<2ul,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>>
              *)(hex_key + 8),&put_ta,data_cb);
  ::std::__shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>);
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>))(libtorrent::dht::item_const&,bool,std::shared_ptr<libtorrent::dht::put_data>const&,std::function<void(libtorrent::dht::item&)>const&)>,std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<libtorrent::dht::put_data>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,std::shared_ptr<libtorrent::dht::put_data>const&)>>
            ((node *)&ta,(public_key *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pk,
             (_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>))(const_libtorrent::dht::item_&,_bool,_const_std::shared_ptr<libtorrent::dht::put_data>_&,_const_std::function<void_(libtorrent::dht::item_&)>_&)>
              *)salt,(_Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::shared_ptr<libtorrent::dht::put_data>_&)>
                      *)hex_key);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  ::std::
  _Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
  ::~_Tuple_impl((_Tuple_impl<2UL,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>_>
                  *)(hex_key + 8));
  (*((ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void node::put_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, int)> f
	, std::function<void(item&)> data_cb)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting put for [ key: %s ]", hex_key);
	}
#endif

	auto put_ta = std::make_shared<dht::put_data>(*this, f);

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt
		, std::bind(&put_data_cb, _1, _2, put_ta, data_cb)
		, std::bind(&put, _1, put_ta));
	ta->start();
}